

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O0

UNION__gl_enumeration __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::toUnionPrefix_UNION__gl_enumeration
          (ColladaParserAutoGen14Private *this,ParserChar *prefixedBuffer,
          ParserChar *prefixedBufferEnd,ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  UNION__gl_enumeration UVar1;
  bool *unaff_retaddr;
  ParserChar *in_stack_00000008;
  _func_UNION__gl_enumeration_ParserChar_ptr_ptr_ParserChar_ptr_bool_ptr *in_stack_00000040;
  
  UVar1 = GeneratedSaxParser::ParserTemplateBase::
          toDataPrefix<COLLADASaxFWL14::UNION__gl_enumeration>
                    ((ParserTemplateBase *)prefixedBufferEnd,(ParserChar *)buffer,bufferEnd,
                     (ParserChar **)failed,in_stack_00000008,unaff_retaddr,in_stack_00000040);
  return UVar1;
}

Assistant:

UNION__gl_enumeration ColladaParserAutoGen14Private::toUnionPrefix_UNION__gl_enumeration (
    const ParserChar* prefixedBuffer,
    const ParserChar* prefixedBufferEnd,
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed
)
{
    return toDataPrefix<UNION__gl_enumeration>(prefixedBuffer, prefixedBufferEnd, buffer, bufferEnd, failed, toUnion_UNION__gl_enumeration);
}